

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_fill_deviate_default
              (ly_ctx *ctx,lys_deviate *deviate,lys_node *dev_target,ly_set *dflt_check,char *value)

{
  byte *pbVar1;
  lys_ext_instance ***ext;
  long lVar2;
  byte bVar3;
  int iVar4;
  size_t sVar5;
  lys_node *plVar6;
  ly_ctx *plVar7;
  LY_ECODE ecode;
  char *pcVar8;
  ulong uVar9;
  lys_node *local_48;
  lys_node *node;
  ly_ctx *local_38;
  
  node = (lys_node *)value;
  local_38 = ctx;
  sVar5 = strlen(value);
  plVar7 = local_38;
  plVar6 = node;
  if (dev_target->nodetype == LYS_LEAF) {
    plVar6 = dev_target[1].prev;
    if (deviate->mod != LY_DEVIATE_DEL) {
      lydict_remove(local_38,(char *)plVar6);
      pbVar1 = (byte *)((long)&dev_target->flags + 1);
      *pbVar1 = *pbVar1 & 0xef;
      plVar6 = (lys_node *)lydict_insert(plVar7,(char *)node,sVar5 & 0xffffffff);
      dev_target[1].prev = plVar6;
      ly_set_add(dflt_check,dev_target,0);
      return 0;
    }
    if (plVar6 != (lys_node *)0x0 && plVar6 == node) {
      lydict_remove(local_38,(char *)plVar6);
      dev_target[1].prev = (lys_node *)0x0;
      pbVar1 = (byte *)((long)&dev_target->flags + 1);
      *pbVar1 = *pbVar1 & 0xef;
      iVar4 = 0;
      while (iVar4 = lys_ext_iter(dev_target->ext,dev_target->ext_size,(uint8_t)iVar4,
                                  LYEXT_SUBSTMT_DEFAULT), iVar4 != -1) {
        lyp_ext_instance_rm(local_38,&dev_target->ext,&dev_target->ext_size,(uint8_t)iVar4);
      }
      return 0;
    }
LAB_00150b55:
    plVar7 = local_38;
    ly_vlog(local_38,LYE_INARG,LY_VLOG_NONE,(void *)0x0,node,"default");
    pcVar8 = "Value differs from the target being deleted.";
LAB_00150b63:
    ly_vlog(plVar7,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,pcVar8);
  }
  else {
    if (dev_target->nodetype == LYS_CHOICE) {
      iVar4 = resolve_choice_default_schema_nodeid((char *)node,dev_target->child,&local_48);
      if (iVar4 == 0 && local_48 != (lys_node *)0x0) {
        if (deviate->mod != LY_DEVIATE_DEL) {
          dev_target[1].name = (char *)local_48;
          return 0;
        }
        if ((lys_node *)dev_target[1].name != (lys_node *)0x0 &&
            (lys_node *)dev_target[1].name == local_48) {
          dev_target[1].name = (char *)0x0;
          iVar4 = 0;
          while (iVar4 = lys_ext_iter(dev_target->ext,dev_target->ext_size,(uint8_t)iVar4,
                                      LYEXT_SUBSTMT_DEFAULT), iVar4 != -1) {
            lyp_ext_instance_rm(local_38,&dev_target->ext,&dev_target->ext_size,(uint8_t)iVar4);
          }
          return 0;
        }
        goto LAB_00150b55;
      }
      ecode = LYE_INARG;
      plVar7 = local_38;
      pcVar8 = (char *)plVar6;
      plVar6 = (lys_node *)0x197c73;
    }
    else {
      if (deviate->mod == LY_DEVIATE_DEL) {
        uVar9 = 0;
LAB_0015094f:
        if (dev_target->padding[2] != uVar9) {
          plVar6 = *(lys_node **)((dev_target[1].prev)->padding + uVar9 * 8 + -0x1c);
          if (plVar6 != node || plVar6 == (lys_node *)0x0) goto code_r0x00150977;
          lydict_remove(dev_target->module->ctx,(char *)plVar6);
          *(undefined8 *)((dev_target[1].prev)->padding + uVar9 * 8 + -0x1c) = 0;
          ext = &dev_target->ext;
          iVar4 = -1;
          while (iVar4 = lys_ext_iter(*ext,dev_target->ext_size,(char)iVar4 + '\x01',
                                      LYEXT_SUBSTMT_DEFAULT), iVar4 != -1) {
            bVar3 = (*ext)[iVar4]->insubstmt_index;
            if ((uint)bVar3 == (uint)uVar9) {
              lyp_ext_instance_rm(local_38,ext,&dev_target->ext_size,(uint8_t)iVar4);
              iVar4 = iVar4 + -1;
            }
            else if ((uint)uVar9 < (uint)bVar3) {
              (*ext)[iVar4]->insubstmt_index = bVar3 - 1;
            }
          }
          if (dev_target->padding[2] != uVar9) {
            return 0;
          }
        }
        plVar7 = local_38;
        ly_vlog(local_38,LYE_INARG,LY_VLOG_NONE,(void *)0x0,node,"default");
        pcVar8 = "The default value to delete not found in the target node.";
        goto LAB_00150b63;
      }
      uVar9 = 0;
      do {
        if (dev_target->padding[2] == uVar9) {
          pcVar8 = lydict_insert(local_38,(char *)node,sVar5 & 0xffffffff);
          plVar6 = dev_target[1].prev;
          bVar3 = dev_target->padding[2];
          dev_target->padding[2] = bVar3 + 1;
          *(char **)(plVar6->padding + (ulong)bVar3 * 8 + -0x1c) = pcVar8;
          ly_set_add(dflt_check,dev_target,0);
          pbVar1 = (byte *)((long)&dev_target->flags + 1);
          *pbVar1 = *pbVar1 & 0xef;
          return 0;
        }
        lVar2 = uVar9 * 8;
        uVar9 = uVar9 + 1;
      } while (*(lys_node **)((dev_target[1].prev)->padding + lVar2 + -0x1c) != node);
      ly_vlog(local_38,LYE_INARG,LY_VLOG_NONE,(void *)0x0,node,"default");
      pcVar8 = "Duplicated default value \"%s\".";
      ecode = LYE_SPEC;
    }
    ly_vlog(plVar7,ecode,LY_VLOG_NONE,(void *)0x0,pcVar8,plVar6);
  }
  return 1;
code_r0x00150977:
  uVar9 = uVar9 + 1;
  goto LAB_0015094f;
}

Assistant:

int
yang_fill_deviate_default(struct ly_ctx *ctx, struct lys_deviate *deviate, struct lys_node *dev_target,
                          struct ly_set *dflt_check, const char *value)
{
    struct lys_node *node;
    struct lys_node_choice *choice;
    struct lys_node_leaf *leaf;
    struct lys_node_leaflist *llist;
    int rc, i, j;
    unsigned int u;

    u = strlen(value);
    if (dev_target->nodetype == LYS_CHOICE) {
        choice = (struct lys_node_choice *)dev_target;
        rc = resolve_choice_default_schema_nodeid(value, choice->child, (const struct lys_node **)&node);
        if (rc || !node) {
            LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
            goto error;
        }
        if (deviate->mod == LY_DEVIATE_DEL) {
            if (!choice->dflt || (choice->dflt != node)) {
                LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Value differs from the target being deleted.");
                goto error;
            }
            choice->dflt = NULL;
            /* remove extensions of this default instance from the target node */
            j = -1;
            while ((j = lys_ext_iter(dev_target->ext, dev_target->ext_size, j + 1, LYEXT_SUBSTMT_DEFAULT)) != -1) {
                lyp_ext_instance_rm(ctx, &dev_target->ext, &dev_target->ext_size, j);
                --j;
            }
        } else { /* add or replace */
            choice->dflt = node;
            if (!choice->dflt) {
                /* default branch not found */
                LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
                goto error;
            }
        }
    } else if (dev_target->nodetype == LYS_LEAF) {
        leaf = (struct lys_node_leaf *)dev_target;
        if (deviate->mod == LY_DEVIATE_DEL) {
            if (!leaf->dflt || !ly_strequal(leaf->dflt, value, 1)) {
                LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Value differs from the target being deleted.");
                goto error;
            }
            /* remove value */
            lydict_remove(ctx, leaf->dflt);
            leaf->dflt = NULL;
            leaf->flags &= ~LYS_DFLTJSON;
            /* remove extensions of this default instance from the target node */
            j = -1;
            while ((j = lys_ext_iter(dev_target->ext, dev_target->ext_size, j + 1, LYEXT_SUBSTMT_DEFAULT)) != -1) {
                lyp_ext_instance_rm(ctx, &dev_target->ext, &dev_target->ext_size, j);
                --j;
            }
        } else { /* add (already checked) and replace */
            /* remove value */
            lydict_remove(ctx, leaf->dflt);
            leaf->flags &= ~LYS_DFLTJSON;

            /* set new value */
            leaf->dflt = lydict_insert(ctx, value, u);

            /* remember to check it later (it may not fit now, but the type can be deviated too) */
            ly_set_add(dflt_check, dev_target, 0);
        }
    } else { /* LYS_LEAFLIST */
        llist = (struct lys_node_leaflist *)dev_target;
        if (deviate->mod == LY_DEVIATE_DEL) {
            /* find and remove the value in target list */
            for (i = 0; i < llist->dflt_size; i++) {
                if (llist->dflt[i] && ly_strequal(llist->dflt[i], value, 1)) {
                    /* match, remove the value */
                    lydict_remove(llist->module->ctx, llist->dflt[i]);
                    llist->dflt[i] = NULL;
                    /* remove extensions of this default instance from the target node */
                    j = -1;
                    while ((j = lys_ext_iter(dev_target->ext, dev_target->ext_size, j + 1, LYEXT_SUBSTMT_DEFAULT)) != -1) {
                        if (dev_target->ext[j]->insubstmt_index == i) {
                            lyp_ext_instance_rm(ctx, &dev_target->ext, &dev_target->ext_size, j);
                            --j;
                        } else if (dev_target->ext[j]->insubstmt_index > i) {
                            /* decrease the substatement index of the extension because of the changed array of defaults */
                            dev_target->ext[j]->insubstmt_index--;
                        }
                    }
                    break;
                }
            }
            if (i == llist->dflt_size) {
                LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "The default value to delete not found in the target node.");
                goto error;
            }
        } else {
            /* add or replace, anyway we place items into the deviate's list
               which propagates to the target */
            /* we just want to check that the value isn't already in the list */
            for (i = 0; i < llist->dflt_size; i++) {
                if (ly_strequal(llist->dflt[i], value, 1)) {
                    LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Duplicated default value \"%s\".", value);
                    goto error;
                }
            }
            /* store it in target node */
            llist->dflt[llist->dflt_size++] = lydict_insert(ctx, value, u);

            /* remember to check it later (it may not fit now, but the type can be deviated too) */
            ly_set_add(dflt_check, dev_target, 0);
            llist->flags &= ~LYS_DFLTJSON;
        }
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}